

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

void __thiscall CScript::AppendDataSize(CScript *this,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  long *last;
  CScript *pCVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  value_type_conflict3 data [2];
  undefined1 local_24 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (size < 0x4c) {
    uVar1 = (this->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar3 = this;
    }
    iVar4.ptr = (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2);
  }
  else {
    if (0xff < size) {
      uVar1 = (this->super_CScriptBase)._size;
      uVar2 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar2 = uVar1;
      }
      pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar1 < 0x1d) {
        pCVar3 = this;
      }
      iVar4.ptr = (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2);
      if (size < 0x10000) {
        local_24[0] = 0x4d;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                  (&this->super_CScriptBase,iVar4,local_24);
        local_24._0_2_ = (short)size;
        uVar1 = (this->super_CScriptBase)._size;
        uVar2 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar2 = uVar1;
        }
        pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar1 < 0x1d) {
          pCVar3 = this;
        }
        iVar4.ptr = (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2);
        last = (long *)(local_24 + 2);
      }
      else {
        local_24[0] = 0x4e;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                  (&this->super_CScriptBase,iVar4,local_24);
        uVar1 = (this->super_CScriptBase)._size;
        uVar2 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar2 = uVar1;
        }
        pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar1 < 0x1d) {
          pCVar3 = this;
        }
        iVar4.ptr = (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2);
        last = &local_20;
        local_24 = (undefined1  [4])size;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert<const_unsigned_char_*>
                (&this->super_CScriptBase,iVar4,local_24,(uchar *)last);
      goto LAB_002ec878;
    }
    uVar1 = (this->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar3 = this;
    }
    local_24[0] = 'L';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&this->super_CScriptBase,
               (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2),local_24);
    uVar1 = (this->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    pCVar3 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      pCVar3 = this;
    }
    iVar4.ptr = (uchar *)((long)&(pCVar3->super_CScriptBase)._union + (long)(int)uVar2);
  }
  local_24[0] = (char)size;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert(&this->super_CScriptBase,iVar4,local_24);
LAB_002ec878:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void AppendDataSize(const uint32_t size)
    {
        if (size < OP_PUSHDATA1) {
            insert(end(), static_cast<value_type>(size));
        } else if (size <= 0xff) {
            insert(end(), OP_PUSHDATA1);
            insert(end(), static_cast<value_type>(size));
        } else if (size <= 0xffff) {
            insert(end(), OP_PUSHDATA2);
            value_type data[2];
            WriteLE16(data, size);
            insert(end(), std::cbegin(data), std::cend(data));
        } else {
            insert(end(), OP_PUSHDATA4);
            value_type data[4];
            WriteLE32(data, size);
            insert(end(), std::cbegin(data), std::cend(data));
        }
    }